

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scrubbers.cpp
# Opt level: O1

Scrubber *
ApprovalTests::Scrubbers::createRegexScrubber
          (Scrubber *__return_storage_ptr__,regex *regexPattern,string *replacementText)

{
  pointer pcVar1;
  string *psVar2;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  pcVar1 = (replacementText->_M_dataplus)._M_p;
  local_40 = local_30;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + replacementText->_M_string_length);
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  psVar2 = (string *)operator_new(0x20);
  *(string **)psVar2 = psVar2 + 0x10;
  ::std::__cxx11::string::_M_construct<char*>(psVar2,local_40,local_40 + local_38);
  pcStack_50 = ::std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/scrubbers/Scrubbers.cpp:47:31)>
               ::_M_invoke;
  local_58 = ::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/scrubbers/Scrubbers.cpp:47:31)>
             ::_M_manager;
  local_68._M_unused._0_8_ = (undefined8)psVar2;
  createRegexScrubber(__return_storage_ptr__,regexPattern,(RegexReplacer *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)((_Any_data *)&local_68,(_Any_data *)&local_68,__destroy_functor);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

Scrubber createRegexScrubber(const std::regex& regexPattern,
                                     const std::string& replacementText)
        {
            return createRegexScrubber(
                regexPattern, [=](const RegexMatch&) { return replacementText; });
        }